

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_data qpdf_init(void)

{
  _qpdf_data *this;
  __shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this = (_qpdf_data *)operator_new(0x148);
  memset(this,0,0x148);
  _qpdf_data::_qpdf_data(this);
  QPDF::create();
  std::__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

qpdf_data
qpdf_init()
{
    QTC::TC("qpdf", "qpdf-c called qpdf_init");
    auto qpdf = new _qpdf_data();
    qpdf->qpdf = QPDF::create();
    return qpdf;
}